

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

idx_t __thiscall
duckdb::ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_>::Seek
          (ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_> *this,idx_t row_idx)

{
  bool bVar1;
  sel_t sVar2;
  uint *puVar3;
  ValidityMask *pVVar4;
  ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_> *in_RSI;
  ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_> *in_RDI;
  
  bVar1 = RowIsVisible(in_RDI,(idx_t)in_RSI);
  if (!bVar1) {
    duckdb::ColumnDataCollection::Seek
              ((ulong)in_RDI->inputs,(ColumnDataScanState *)in_RSI,(DataChunk *)in_RDI->scan);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_RSI,(size_type)in_RDI);
    puVar3 = FlatVector::GetData<unsigned_int>((Vector *)0xb127c8);
    in_RDI->data = puVar3;
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_RSI,(size_type)in_RDI);
    pVVar4 = FlatVector::Validity((Vector *)0xb127e8);
    in_RDI->validity = pVVar4;
  }
  sVar2 = RowOffset(in_RSI,(idx_t)in_RDI);
  return (ulong)sVar2;
}

Assistant:

inline idx_t Seek(idx_t row_idx) {
		if (!RowIsVisible(row_idx)) {
			D_ASSERT(inputs);
			inputs->Seek(row_idx, *scan, page);
			data = FlatVector::GetData<KEY_TYPE>(page.data[0]);
			validity = &FlatVector::Validity(page.data[0]);
		}
		return RowOffset(row_idx);
	}